

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

char * uloc_toLegacyKey_63(char *keyword)

{
  UBool UVar1;
  char *pcVar2;
  char *legacyKey;
  char *keyword_local;
  
  pcVar2 = ulocimp_toLegacyKey_63(keyword);
  if ((pcVar2 != (char *)0x0) ||
     (UVar1 = isWellFormedLegacyKey(keyword), keyword_local = keyword, UVar1 == '\0')) {
    keyword_local = pcVar2;
  }
  return keyword_local;
}

Assistant:

U_CAPI const char* U_EXPORT2
uloc_toLegacyKey(const char* keyword)
{
    const char* legacyKey = ulocimp_toLegacyKey(keyword);
    if (legacyKey == NULL) {
        // Checks if the specified locale key is well-formed with the legacy locale syntax.
        //
        // Note:
        //  LDML/CLDR provides some definition of keyword syntax in
        //  * http://www.unicode.org/reports/tr35/#Unicode_locale_identifier and
        //  * http://www.unicode.org/reports/tr35/#Old_Locale_Extension_Syntax
        //  Keys can only consist of [0-9a-zA-Z].
        if (isWellFormedLegacyKey(keyword)) {
            return keyword;
        }
    }
    return legacyKey;
}